

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O3

bool __thiscall FDInfo::UpdateFrom(FDInfo *this,LTFlightData *fd)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double dVar4;
  int iVar5;
  pointer pcVar6;
  LTAircraft *this_00;
  positionTy *from;
  double dVar7;
  uint uVar8;
  bool bVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  ulong __val;
  float fVar15;
  char s [50];
  FDDynamicData dyn;
  vectorTy vecCam;
  FDStaticData stat;
  string in_stack_fffffffffffffd28;
  undefined1 local_298 [72];
  long *local_250 [2];
  long local_240 [2];
  undefined1 local_230 [40];
  double local_208;
  double local_200;
  LTChannel *local_1f0;
  vectorTy local_1e8;
  FDStaticData local_1c8;
  
  this->bUpToDate = true;
  (this->key).eKeyType = (fd->acKey).eKeyType;
  std::__cxx11::string::_M_assign((string *)&(this->key).key);
  (this->key).num = (fd->acKey).num;
  paVar3 = &local_1c8.reg.field_2;
  pcVar6 = (this->key).key._M_dataplus._M_p;
  local_1c8.reg._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar6,pcVar6 + (this->key).key._M_string_length);
  std::__cxx11::string::operator=((string *)&this->v,(string *)&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.reg._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8.reg._M_dataplus._M_p,
                    CONCAT71(local_1c8.reg.field_2._M_allocated_capacity._1_7_,
                             local_1c8.reg.field_2._M_local_buf[0]) + 1);
  }
  pcVar10 = LTFlightData::FDKeyTy::GetKeyTypeText(&this->key);
  pcVar13 = (char *)(this->v)._M_elems[1]._M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)((this->v)._M_elems + 1),0,pcVar13,(ulong)pcVar10);
  local_1c8.country._M_dataplus._M_p = (pointer)&local_1c8.country.field_2;
  local_1c8.reg._M_dataplus._M_p = (pointer)&local_1c8.reg.field_2;
  local_1c8.reg._M_string_length = 0;
  local_1c8.reg.field_2._M_local_buf[0] = '\0';
  local_1c8.country._M_string_length = 0;
  local_1c8.country.field_2._M_local_buf[0] = '\0';
  local_1c8.acTypeIcao._M_dataplus._M_p = (pointer)&local_1c8.acTypeIcao.field_2;
  local_1c8.acTypeIcao._M_string_length = 0;
  local_1c8.acTypeIcao.field_2._M_local_buf[0] = '\0';
  local_1c8.man._M_dataplus._M_p = (pointer)&local_1c8.man.field_2;
  local_1c8.man._M_string_length = 0;
  local_1c8.man.field_2._M_local_buf[0] = '\0';
  local_1c8.mdl._M_dataplus._M_p = (pointer)&local_1c8.mdl.field_2;
  local_1c8.mdl._M_string_length = 0;
  local_1c8.mdl.field_2._M_local_buf[0] = '\0';
  local_1c8.catDescr._M_dataplus._M_p = (pointer)&local_1c8.catDescr.field_2;
  local_1c8.catDescr._M_string_length = 0;
  local_1c8.catDescr.field_2._M_local_buf[0] = '\0';
  local_1c8.engType = -1;
  local_1c8.engMount = -1;
  local_1c8.year = 0;
  local_1c8.mil = false;
  local_1c8.pDoc8643 = (Doc8643 *)0x0;
  local_1c8.call._M_dataplus._M_p = (pointer)&local_1c8.call.field_2;
  local_1c8.call._M_string_length = 0;
  local_1c8.call.field_2._M_local_buf[0] = '\0';
  local_1c8.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.flight._M_dataplus._M_p = (pointer)&local_1c8.flight.field_2;
  local_1c8.flight._M_string_length = 0;
  local_1c8.flight.field_2._M_local_buf[0] = '\0';
  local_1c8.slug._M_dataplus._M_p = (pointer)&local_1c8.slug.field_2;
  local_1c8.slug._M_string_length = 0;
  local_1c8.slug.field_2._M_local_buf[0] = '\0';
  local_1c8.op._M_dataplus._M_p = (pointer)&local_1c8.op.field_2;
  local_1c8.op._M_string_length = 0;
  local_1c8.op.field_2._M_local_buf[0] = '\0';
  local_1c8.opIcao._M_dataplus._M_p = (pointer)&local_1c8.opIcao.field_2;
  local_1c8.opIcao._M_string_length = 0;
  local_1c8.opIcao.field_2._M_local_buf[0] = '\0';
  local_1c8.bDataMaster = false;
  local_1c8.bDataRoute = false;
  bVar9 = LTFlightData::TryGetSafeCopy(fd,&local_1c8);
  if (bVar9) {
    pcVar6 = (this->v)._M_elems[0]._M_dataplus._M_p;
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_250,pcVar6,pcVar6 + (this->v)._M_elems[0]._M_string_length);
    LTFlightData::FDStaticData::acId((string *)local_230,&local_1c8,in_stack_fffffffffffffd28);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 2),(string *)local_230);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    if (local_250[0] != local_240) {
      operator_delete(local_250[0],local_240[0] + 1);
    }
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 3));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 4));
    Doc8643::get(&local_1c8.acTypeIcao);
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 5));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 6));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 7));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 8));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 9));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 10));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 0xc));
    LTFlightData::FDStaticData::route_abi_cxx11_((string *)local_230,&local_1c8);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0xd),(string *)local_230);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
  }
  else {
    this->bUpToDate = false;
  }
  LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)local_230);
  bVar9 = LTFlightData::TryGetSafeCopy(fd,(FDDynamicData *)local_230);
  if (bVar9) {
    __val = -local_230._8_8_;
    if (0 < (long)local_230._8_8_) {
      __val = local_230._8_8_;
    }
    uVar14 = 1;
    if (9 < __val) {
      uVar12 = __val;
      uVar8 = 4;
      do {
        uVar14 = uVar8;
        if (uVar12 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00122994;
        }
        if (uVar12 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00122994;
        }
        if (uVar12 < 10000) goto LAB_00122994;
        bVar9 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        uVar8 = uVar14 + 4;
      } while (bVar9);
      uVar14 = uVar14 + 1;
    }
LAB_00122994:
    local_298._0_8_ = local_298 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_298,(char)uVar14 - (SUB81(local_230._8_8_,7) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)(local_298._0_8_ + -((long)local_230._8_8_ >> 0x3f)),uVar14,__val);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0xb),(string *)local_298);
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    if (local_1f0 == (LTChannel *)0x0) {
      (this->v)._M_elems[0x1f]._M_string_length = 0;
      *(this->v)._M_elems[0x1f]._M_dataplus._M_p = '\0';
      (this->v)._M_elems[0x1e]._M_string_length = 0;
      *(this->v)._M_elems[0x1e]._M_dataplus._M_p = '\0';
      (this->vf)._M_elems[0x1e] = NAN;
    }
    else {
      pcVar13 = local_1f0->pszChName;
      pcVar10 = (char *)(this->v)._M_elems[0x1f]._M_string_length;
      strlen(pcVar13);
      std::__cxx11::string::_M_replace((ulong)((this->v)._M_elems + 0x1f),0,pcVar10,(ulong)pcVar13);
      fVar15 = (float)(fd->youngestTS - dataRefs.lastSimTime);
      (this->vf)._M_elems[0x1e] = fVar15;
      snprintf(&stack0xfffffffffffffd28,0x32,"%+.f",SUB84((double)fVar15,0));
      pcVar13 = (char *)(this->v)._M_elems[0x1e]._M_string_length;
      strlen(&stack0xfffffffffffffd28);
      std::__cxx11::string::_M_replace
                ((ulong)((this->v)._M_elems + 0x1e),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
    }
  }
  else {
    this->bUpToDate = false;
  }
  this_00 = fd->pAc;
  if (this_00 == (LTAircraft *)0x0) {
    if ((this->v)._M_elems[0xf]._M_string_length != 0) {
      lVar11 = 0;
      do {
        uVar14 = *(uint *)((long)&DAT_00246640 + lVar11);
        (this->vf)._M_elems[uVar14] = NAN;
        (this->v)._M_elems[uVar14]._M_string_length = 0;
        *(this->v)._M_elems[uVar14]._M_dataplus._M_p = '\0';
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x54);
    }
    from = (fd->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
    if ((fd->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != from) {
      dVar4 = from->_lat;
      (this->vf)._M_elems[0x10] = (float)dVar4;
      snprintf(&stack0xfffffffffffffd28,0x32,"%.4f",SUB84((double)(float)dVar4,0));
      pcVar13 = (char *)(this->v)._M_elems[0x10]._M_string_length;
      strlen(&stack0xfffffffffffffd28);
      std::__cxx11::string::_M_replace
                ((ulong)((this->v)._M_elems + 0x10),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
      dVar4 = from->_lon;
      (this->vf)._M_elems[0x11] = (float)dVar4;
      snprintf(&stack0xfffffffffffffd28,0x32,"%.4f",SUB84((double)(float)dVar4,0));
      pcVar13 = (char *)(this->v)._M_elems[0x11]._M_string_length;
      strlen(&stack0xfffffffffffffd28);
      std::__cxx11::string::_M_replace
                ((ulong)((this->v)._M_elems + 0x11),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
      fVar15 = (float)(from->_alt / 0.3048);
      (this->vf)._M_elems[0x12] = fVar15;
      snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)fVar15,0));
      pcVar13 = (char *)(this->v)._M_elems[0x12]._M_string_length;
      strlen(&stack0xfffffffffffffd28);
      std::__cxx11::string::_M_replace
                ((ulong)((this->v)._M_elems + 0x12),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
      DataRefs::GetViewPos();
      CoordVectorBetween(&local_1e8,from,(positionTy *)local_298);
      (this->vf)._M_elems[0x1b] = (float)local_1e8.angle;
      snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)(float)local_1e8.angle,0));
      pcVar13 = (char *)(this->v)._M_elems[0x1b]._M_string_length;
      strlen(&stack0xfffffffffffffd28);
      std::__cxx11::string::_M_replace
                ((ulong)((this->v)._M_elems + 0x1b),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
      (this->vf)._M_elems[0x1c] = (float)(local_1e8.dist / 1852.0);
      snprintf(&stack0xfffffffffffffd28,0x32,"%.1f",
               SUB84((double)(float)(local_1e8.dist / 1852.0),0));
      pcVar13 = (char *)(this->v)._M_elems[0x1c]._M_string_length;
      strlen(&stack0xfffffffffffffd28);
      std::__cxx11::string::_M_replace
                ((ulong)((this->v)._M_elems + 0x1c),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
      if (!NAN(from->_head)) {
        fVar15 = (float)from->_head;
        (this->vf)._M_elems[0x18] = fVar15;
        snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)fVar15,0));
        pcVar13 = (char *)(this->v)._M_elems[0x18]._M_string_length;
        strlen(&stack0xfffffffffffffd28);
        std::__cxx11::string::_M_replace
                  ((ulong)((this->v)._M_elems + 0x18),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
      }
    }
    if (!NAN(local_208)) {
      (this->vf)._M_elems[0x16] = (float)local_208;
      snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)(float)local_208,0));
      pcVar13 = (char *)(this->v)._M_elems[0x16]._M_string_length;
      strlen(&stack0xfffffffffffffd28);
      std::__cxx11::string::_M_replace
                ((ulong)((this->v)._M_elems + 0x16),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
    }
    if (!NAN(local_200)) {
      (this->vf)._M_elems[0x15] = (float)local_200;
      snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)(float)local_200,0));
      pcVar13 = (char *)(this->v)._M_elems[0x15]._M_string_length;
      strlen(&stack0xfffffffffffffd28);
      std::__cxx11::string::_M_replace
                ((ulong)((this->v)._M_elems + 0x15),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
    }
    goto LAB_00123540;
  }
  LTAircraft::RelativePositionText_abi_cxx11_((string *)local_298,this_00);
  std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0xf),(string *)local_298);
  pcVar6 = local_298 + 0x10;
  if ((pointer)local_298._0_8_ != pcVar6) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  fVar15 = (float)(this_00->ppos)._lat;
  (this->vf)._M_elems[0x10] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.4f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x10]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x10),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (float)(this_00->ppos)._lon;
  (this->vf)._M_elems[0x11] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.4f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x11]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x11),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (float)((this_00->ppos)._alt / 0.3048);
  (this->vf)._M_elems[0x12] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x12]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x12),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (float)(((this_00->ppos)._alt - this_00->terrainAlt_m) / 0.3048);
  (this->vf)._M_elems[0x13] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x13]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x13),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  dVar4 = this_00->vsi;
  (this->vf)._M_elems[0x15] = (float)dVar4;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)(float)dVar4,0));
  pcVar13 = (char *)(this->v)._M_elems[0x15]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x15),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  dVar7 = (double)(this->vf)._M_elems[0x15];
  dVar4 = this_00->pMdl->VSI_STABLE;
  pbVar1 = (this->v)._M_elems + 0x14;
  psVar2 = &(this->v)._M_elems[0x14]._M_string_length;
  if (-dVar4 <= dVar7) {
    if (dVar4 < dVar7) {
      pcVar13 = anon_var_dwarf_4eef;
      goto LAB_001230ab;
    }
    *psVar2 = 0;
    *(pbVar1->_M_dataplus)._M_p = '\0';
  }
  else {
    pcVar13 = anon_var_dwarf_4efa;
LAB_001230ab:
    std::__cxx11::string::_M_replace((ulong)pbVar1,0,(char *)*psVar2,(ulong)pcVar13);
  }
  fVar15 = (float)(this_00->speed).currSpeed_kt;
  (this->vf)._M_elems[0x16] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x16]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x16),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (float)(this_00->vec).angle;
  (this->vf)._M_elems[0x17] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x17]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x17),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (float)((this_00->ppos)._head + (this_00->corrAngle).val);
  (this->vf)._M_elems[0x18] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x18]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x18),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (float)(this_00->ppos)._pitch;
  (this->vf)._M_elems[0x19] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.1f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x19]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x19),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (float)(this_00->ppos)._roll;
  (this->vf)._M_elems[0x1a] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.1f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x1a]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x1a),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (this_00->super_Aircraft).camBearing;
  (this->vf)._M_elems[0x1b] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x1b]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x1b),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (this_00->super_Aircraft).camDist / 1852.0;
  (this->vf)._M_elems[0x1c] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.1f",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x1c]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x1c),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  XPMP2::Aircraft::GetModelName_abi_cxx11_(&this_00->super_Aircraft);
  std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 0x1d));
  LTAircraft::GetFlightPhaseRwyString_abi_cxx11_((string *)local_298,this_00);
  std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0x20),(string *)local_298);
  if ((pointer)local_298._0_8_ != pcVar6) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  (this->vf)._M_elems[0x20] = (float)this_00->phase;
  fVar15 = (float)((this_00->gear).val * 100.0);
  (this->vf)._M_elems[0x21] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f%%",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x21]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x21),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  fVar15 = (float)((this_00->flaps).val * 100.0);
  (this->vf)._M_elems[0x22] = fVar15;
  snprintf(&stack0xfffffffffffffd28,0x32,"%.f%%",SUB84((double)fVar15,0));
  pcVar13 = (char *)(this->v)._M_elems[0x22]._M_string_length;
  strlen(&stack0xfffffffffffffd28);
  std::__cxx11::string::_M_replace
            ((ulong)((this->v)._M_elems + 0x22),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  LTAircraft::GetLightsStr_abi_cxx11_((string *)local_298,this_00);
  std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0x23),(string *)local_298);
  if ((pointer)local_298._0_8_ != pcVar6) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  iVar5 = (this_00->super_Aircraft).tcasTargetIdx;
  if (iVar5 < 1) {
    (this->vf)._M_elems[0x24] = NAN;
    (this->v)._M_elems[0x24]._M_string_length = 0;
    *(this->v)._M_elems[0x24]._M_dataplus._M_p = '\0';
  }
  else {
    (this->vf)._M_elems[0x24] = (float)iVar5;
    snprintf(&stack0xfffffffffffffd28,0x32,"%.f",SUB84((double)iVar5,0));
    pcVar13 = (char *)(this->v)._M_elems[0x24]._M_string_length;
    strlen(&stack0xfffffffffffffd28);
    std::__cxx11::string::_M_replace
              ((ulong)((this->v)._M_elems + 0x24),0,pcVar13,(ulong)&stack0xfffffffffffffd28);
  }
  std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 0x25));
LAB_00123540:
  bVar9 = this->bUpToDate;
  LTFlightData::FDStaticData::~FDStaticData(&local_1c8);
  return bVar9;
}

Assistant:

bool FDInfo::UpdateFrom (const LTFlightData& fd)
{
    // buffer and macro for converting numeric data
    char s[50];
#define v_f(idx,fmt,val) vf[idx] = float(val); snprintf(s, sizeof(s), fmt, vf[idx]); v[idx] = s;

    bUpToDate = true;
    v[ACT_COL_KEY] = key = fd.key();    // possible without lock
    v[ACT_COL_KEY_TYPE]  = key.GetKeyTypeText();

    // try fetching some static data
    LTFlightData::FDStaticData stat;
    if (fd.TryGetSafeCopy(stat)) {
        v[ACT_COL_ID]           = stat.acId(v[ACT_COL_KEY]);
        v[ACT_COL_REG]          = stat.reg;
        v[ACT_COL_TYPE]         = stat.acTypeIcao;
        v[ACT_COL_CLASS]        = Doc8643::get(stat.acTypeIcao).classification;
        v[ACT_COL_MAN]          = stat.man;
        v[ACT_COL_MDL]          = stat.mdl;
        v[ACT_COL_CAT_DESCR]    = stat.catDescr;
        v[ACT_COL_OP]           = stat.op;
        v[ACT_COL_CALLSIGN]     = stat.call;
        v[ACT_COL_FLIGHT]       = stat.flight;
        v[ACT_COL_ROUTE]        = stat.route();
    } else
        bUpToDate = false;
    
    // try fetching some dynamic data
    LTFlightData::FDDynamicData dyn;
    if (fd.TryGetSafeCopy(dyn)) {
        v[ACT_COL_SQUAWK]       = std::to_string(dyn.radar.code);
        if (dyn.pChannel) {
            v[ACT_COL_CHANNEL]  = dyn.pChannel->ChName();
            // last flight data / channel
            v_f(ACT_COL_LASTDATA, "%+.f", fd.GetYoungestTS() - dataRefs.GetSimTime());
        } else {
            v[ACT_COL_CHANNEL].clear();
            v[ACT_COL_LASTDATA].clear();
            vf[ACT_COL_LASTDATA] = NAN;
        }
    } else
        bUpToDate = false;
    
    
    // try fetching some actual flight data
    LTAircraft* pAc = fd.GetAircraft();
    if (pAc) {
        v[ACT_COL_POS]          = pAc->RelativePositionText();
        v_f(ACT_COL_LAT,    "%.4f",     pAc->GetPPos().lat());
        v_f(ACT_COL_LON,    "%.4f",     pAc->GetPPos().lon());
        v_f(ACT_COL_ALT,    "%.f",      pAc->GetAlt_ft());
        v_f(ACT_COL_AGL,    "%.f",      pAc->GetPHeight_ft());
        v_f(ACT_COL_VSI,    "%.f",      pAc->GetVSI_ft());
        if (vf[ACT_COL_VSI] < -pAc->pMdl->VSI_STABLE)     // up/down arrow depending on value of VSI
            v[ACT_COL_UPDOWN] = ICON_FA_CHEVRON_DOWN;
        else if (vf[ACT_COL_VSI] > pAc->pMdl->VSI_STABLE)
            v[ACT_COL_UPDOWN] = ICON_FA_CHEVRON_UP;
        else
            v[ACT_COL_UPDOWN].clear();
        v_f(ACT_COL_SPEED,  "%.f",      pAc->GetSpeed_kt());
        v_f(ACT_COL_TRACK,  "%.f",      pAc->GetTrack());
        v_f(ACT_COL_HEADING,"%.f",      pAc->GetHeading());
        v_f(ACT_COL_PITCH,  "%.1f",     pAc->GetPitch());
        v_f(ACT_COL_ROLL,   "%.1f",     pAc->GetRoll());
        v_f(ACT_COL_BEARING,"%.f",      pAc->GetCameraBearing());
        v_f(ACT_COL_DIST,   "%.1f",     pAc->GetCameraDist() / M_per_NM);
        
        v[ACT_COL_CSLMDL]       = pAc->GetModelName();
        v[ACT_COL_PHASE]        = pAc->GetFlightPhaseRwyString();
        vf[ACT_COL_PHASE]       = float(pAc->GetFlightPhase()); // sort flight phase by its index
        v_f(ACT_COL_GEAR,   "%.f%%",    pAc->GetGearPos() * 100.0);
        v_f(ACT_COL_FLAPS,  "%.f%%",    pAc->GetFlapsPos() * 100.0);
        v[ACT_COL_LIGHTS]       = pAc->GetLightsStr();
        if (pAc->IsCurrentlyShownAsTcasTarget()) {
            v_f(ACT_COL_TCAS_IDX, "%.f", pAc->GetTcasTargetIdx());
        } else {
            vf[ACT_COL_TCAS_IDX] = NAN;
            v[ACT_COL_TCAS_IDX].clear();
        }
        v[ACT_COL_FLIGHTMDL]    = pAc->pMdl->modelName;
            
    }
    else {
        // if there is no a/c, but there previously was, then we need to clear a lot of fields
        if (!v[ACT_COL_POS].empty()) {
            for (size_t idx: {
                ACT_COL_POS, ACT_COL_LAT, ACT_COL_LON, ACT_COL_ALT, ACT_COL_AGL,
                ACT_COL_VSI, ACT_COL_UPDOWN, ACT_COL_SPEED, ACT_COL_TRACK, ACT_COL_HEADING,
                ACT_COL_PITCH, ACT_COL_ROLL, ACT_COL_BEARING, ACT_COL_DIST,
                ACT_COL_CSLMDL, ACT_COL_PHASE, ACT_COL_GEAR, ACT_COL_FLAPS,
                ACT_COL_LIGHTS, ACT_COL_TCAS_IDX, ACT_COL_FLIGHTMDL
            })
            { vf[idx] = NAN; v[idx].clear(); }
        }
        
        // We can try finding some positional information in the pos deque
        const dequePositionTy& posDeque = fd.GetPosDeque();
        if (!posDeque.empty()) {
            const positionTy& firstPos = posDeque.front();
            v_f(ACT_COL_LAT,    "%.4f",     firstPos.lat());
            v_f(ACT_COL_LON,    "%.4f",     firstPos.lon());
            v_f(ACT_COL_ALT,    "%.f",      firstPos.alt_ft());
            const vectorTy vecCam = firstPos.between(dataRefs.GetViewPos());
            v_f(ACT_COL_BEARING,"%.f",      vecCam.angle);
            v_f(ACT_COL_DIST,   "%.1f",     vecCam.dist / M_per_NM);
            if (!std::isnan(firstPos.heading())) {
                v_f(ACT_COL_HEADING, "%.f", firstPos.heading());
            }
        }
        if (!std::isnan(dyn.spd)) {
            v_f(ACT_COL_SPEED,  "%.f",      dyn.spd);
        }
        if (!std::isnan(dyn.vsi)) {
            v_f(ACT_COL_VSI,    "%.f",      dyn.vsi);
        }
    }
    
    // Have we successfully updated?
    return bUpToDate;
}